

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O2

bool __thiscall
QMarkdownTextEdit::increaseSelectedTextIndention
          (QMarkdownTextEdit *this,bool reverse,QString *indentCharacters)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  char cVar5;
  MoveMode MVar6;
  MoveMode MVar7;
  int iVar8;
  QString *pQVar9;
  QString *this_00;
  int iVar10;
  QArrayDataPointer<char16_t> *this_01;
  QTextCursor cursor;
  QArrayDataPointer<char16_t> local_1c8;
  QRegularExpression re;
  QString newText;
  QString newLine;
  QArrayDataPointer<char16_t> local_158;
  QMarkdownTextEdit *local_138;
  QRegularExpression local_130;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  
  local_138 = this;
  QPlainTextEdit::textCursor();
  QTextCursor::selectedText();
  if (local_c8.size == 0) {
    if (reverse) {
      iVar8 = (int)(indentCharacters->d).size;
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      while (bVar4 = iVar8 != 0, iVar8 = iVar8 + -1, bVar4) {
        MVar6 = QTextCursor::position();
        cVar5 = QTextCursor::atStart();
        iVar10 = (int)&cursor;
        if (cVar5 == '\0') {
          QTextCursor::setPosition(iVar10,MVar6 - KeepAnchor);
        }
        newLine.d.d = (Data *)0x0;
        newLine.d.ptr = L"[\\t ]";
        newLine.d.size = 5;
        newText.d.d = (Data *)0x0;
        newText.d.ptr = (char16_t *)0x0;
        newText.d.size = 0;
        QRegularExpression::QRegularExpression(&re,&newLine.d,0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&newLine.d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&newText.d);
        QTextCursor::selectedText();
        QRegularExpression::match(&newText.d,&re,&newLine.d,0,0,0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&newLine.d);
        cVar5 = QRegularExpressionMatch::hasMatch();
        if (cVar5 == '\0') {
          QTextCursor::setPosition(iVar10,MVar6);
          cVar5 = QTextCursor::atEnd();
          if (cVar5 == '\0') {
            QTextCursor::setPosition(iVar10,MVar6 + KeepAnchor);
          }
        }
        QTextCursor::selectedText();
        QRegularExpression::match(&local_1c8,&re,&newLine.d,0,0,0);
        pDVar1 = newText.d.d;
        newText.d.d = local_1c8.d;
        local_1c8.d = pDVar1;
        QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_1c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&newLine.d);
        cVar5 = QRegularExpressionMatch::hasMatch();
        if (cVar5 != '\0') {
          QTextCursor::removeSelectedText();
        }
        QPlainTextEdit::textCursor();
        pDVar1 = _cursor;
        _cursor = newLine.d.d;
        newLine.d.d = pDVar1;
        QTextCursor::~QTextCursor((QTextCursor *)&newLine.d);
        QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&newText.d);
        QRegularExpression::~QRegularExpression(&re);
      }
    }
    else {
      QTextCursor::insertText((QString *)&cursor);
    }
  }
  else {
    MVar6 = QTextCursor::selectionEnd();
    MVar7 = QTextCursor::selectionStart();
    QTextCursor::setPosition((int)&cursor,MVar7);
    iVar8 = 4;
    QTextCursor::movePosition((MoveOperation)&cursor,4,0);
    QTextCursor::setPosition((int)&cursor,MVar6);
    QPlainTextEdit::setTextCursor((QTextCursor *)local_138);
    QTextCursor::selectedText();
    qVar3 = local_c8.size;
    pcVar2 = local_c8.ptr;
    pDVar1 = local_c8.d;
    local_c8.d = newLine.d.d;
    local_c8.ptr = newLine.d.ptr;
    newLine.d.d = pDVar1;
    newLine.d.ptr = pcVar2;
    local_c8.size = newLine.d.size;
    newLine.d.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&newLine.d);
    local_1c8.d = (Data *)0x0;
    local_1c8.ptr = L"e280a9";
    re.d.d = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
             (QRegularExpressionPrivate *)0x0;
    local_1c8.size = 6;
    QByteArray::fromHex((QByteArray *)&newText);
    QString::fromUtf8<void>(&newLine,(QByteArray *)&newText);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&newText);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&re);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1c8);
    newText.d.d = (Data *)0x0;
    newText.d.ptr = (char16_t *)0x0;
    newText.d.size = 0;
    if (reverse) {
      re.d.d = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
               (QRegularExpressionPrivate *)0x0;
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = (char16_t *)0x0;
      local_1c8.size = 0;
      bVar4 = operator==(indentCharacters,(QString *)&re);
      if (!bVar4) {
        iVar8 = (int)(indentCharacters->d).size;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&re);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      local_a8.d = (Data *)0x0;
      local_a8.ptr = L"(\\t| {1,";
      local_a8.size = 8;
      local_e8.d = (Data *)0x0;
      local_e8.ptr = (char16_t *)0x0;
      local_e8.size = 0;
      operator+((QString *)&local_158,&newLine,(QString *)&local_a8);
      QString::number((int)&local_108,iVar8);
      operator+((QString *)&local_1c8,(QString *)&local_158,(QString *)&local_108);
      local_128.d = (Data *)0x0;
      local_128.ptr = L"})";
      local_128.size = 2;
      local_88.d = (Data *)0x0;
      local_88.ptr = (char16_t *)0x0;
      local_88.size = 0;
      operator+((QString *)&re,(QString *)&local_1c8,(QString *)&local_128);
      QRegularExpression::QRegularExpression(&local_130,&re,0);
      local_48.d = (Data *)0x0;
      local_48.ptr = L"\n";
      local_48.size = 1;
      local_68.d = (Data *)0x0;
      local_68.ptr = (char16_t *)0x0;
      local_68.size = 0;
      pQVar9 = (QString *)QString::replace((QRegularExpression *)&local_c8,(QString *)&local_130);
      QString::operator=(&newText,pQVar9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      QRegularExpression::~QRegularExpression(&local_130);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&re);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      local_158.d = (Data *)0x0;
      local_158.ptr = L"^(\\t| {1,";
      local_158.size = 9;
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
      QString::number((int)&local_e8,iVar8);
      operator+((QString *)&local_1c8,(QString *)&local_158,(QString *)&local_e8);
      local_108.d = (Data *)0x0;
      local_108.ptr = L"})";
      local_108.size = 2;
      local_128.d = (Data *)0x0;
      local_128.ptr = (char16_t *)0x0;
      local_128.size = 0;
      operator+((QString *)&re,(QString *)&local_1c8,(QString *)&local_108);
      QRegularExpression::QRegularExpression((QRegularExpression *)&local_88,&re,0);
      QString::remove(&newText,(char *)&local_88);
      QRegularExpression::~QRegularExpression((QRegularExpression *)&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&re);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
      this_01 = &local_a8;
    }
    else {
      QRegularExpression::escape((QString *)&local_1c8,&newLine);
      local_158.d = (Data *)0x0;
      local_158.ptr = L"$";
      local_158.size = 1;
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
      operator+((QString *)&re,(QString *)&local_1c8,(QString *)&local_158);
      QRegularExpression::QRegularExpression((QRegularExpression *)&local_128,&re,0);
      local_e8.d = (Data *)0x0;
      local_e8.ptr = L"\n";
      local_e8.size = 1;
      local_108.d = (Data *)0x0;
      local_108.ptr = (char16_t *)0x0;
      local_108.size = 0;
      pQVar9 = (QString *)QString::replace((QRegularExpression *)&local_c8,(QString *)&local_128);
      QString::operator=(&newText,pQVar9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      QRegularExpression::~QRegularExpression((QRegularExpression *)&local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&re);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = L"\n";
      local_1c8.size = 1;
      local_158.d = (Data *)0x0;
      local_158.ptr = (char16_t *)0x0;
      local_158.size = 0;
      operator+((QString *)&re,(QString *)&local_1c8,indentCharacters);
      this_00 = (QString *)
                QString::replace((QString *)&newText,(QString *)&newLine,(CaseSensitivity)&re);
      QString::prepend(this_00,indentCharacters);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&re);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
      re.d.d = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
               (QRegularExpressionPrivate *)0x0;
      local_1c8.d = (Data *)0x0;
      local_1c8.ptr = (char16_t *)0x0;
      local_1c8.size = 0;
      QRegularExpression::QRegularExpression((QRegularExpression *)&local_158,&re,0);
      QString::remove(&newText,(char *)&local_158);
      QRegularExpression::~QRegularExpression((QRegularExpression *)&local_158);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&re);
      this_01 = &local_1c8;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_01);
    QTextCursor::insertText((QString *)&cursor);
    iVar8 = QTextCursor::position();
    QTextCursor::setPosition((int)&cursor,iVar8 - (int)newText.d.size);
    QPlainTextEdit::setTextCursor((QTextCursor *)local_138);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&newText.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&newLine.d);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QTextCursor::~QTextCursor(&cursor);
  return true;
}

Assistant:

bool QMarkdownTextEdit::increaseSelectedTextIndention(
    bool reverse, const QString &indentCharacters) {
    QTextCursor cursor = this->textCursor();
    QString selectedText = cursor.selectedText();

    if (!selectedText.isEmpty()) {
        // Start the selection at start of the first block of the selection
        int end = cursor.selectionEnd();
        cursor.setPosition(cursor.selectionStart());
        cursor.movePosition(QTextCursor::StartOfBlock, QTextCursor::MoveAnchor);
        cursor.setPosition(end, QTextCursor::KeepAnchor);
        this->setTextCursor(cursor);
        selectedText = cursor.selectedText();

        // we need this strange newline character we are getting in the
        // selected text for newlines
        const QString newLine =
            QString::fromUtf8(QByteArray::fromHex(QByteArrayLiteral("e280a9")));
        QString newText;

        if (reverse) {
            // un-indent text

            //          QSettings settings;
            const int indentSize = indentCharacters == QStringLiteral("\t")
                                       ? 4
                                       : indentCharacters.length();

            // remove leading \t or spaces in following lines
            newText = selectedText.replace(
                QRegularExpression(newLine + QStringLiteral("(\\t| {1,") +
                                   QString::number(indentSize) +
                                   QStringLiteral("})")),
                QStringLiteral("\n"));

            // remove leading \t or spaces in first line
            newText.remove(QRegularExpression(QStringLiteral("^(\\t| {1,") +
                                              QString::number(indentSize) +
                                              QStringLiteral("})")));
        } else {
            // replace trailing new line to prevent an indent of the line after
            // the selection
            newText = selectedText.replace(
                QRegularExpression(QRegularExpression::escape(newLine) +
                                   QStringLiteral("$")),
                QStringLiteral("\n"));

            // indent text
            newText.replace(newLine, QStringLiteral("\n") + indentCharacters)
                .prepend(indentCharacters);

            // remove trailing \t
            newText.remove(QRegularExpression(QStringLiteral("\\t$")));
        }

        // insert the new text
        cursor.insertText(newText);

        // update the selection to the new text
        cursor.setPosition(cursor.position() - newText.size(),
                           QTextCursor::KeepAnchor);
        this->setTextCursor(cursor);

        return true;
    } else if (reverse) {
        const int indentSize = indentCharacters.length();

        // do the check as often as we have characters to un-indent
        for (int i = 1; i <= indentSize; i++) {
            // if nothing was selected but we want to reverse the indention
            // check if there is a \t in front or after the cursor and remove it
            // if so
            const int position = cursor.position();

            if (!cursor.atStart()) {
                // get character in front of cursor
                cursor.setPosition(position - 1, QTextCursor::KeepAnchor);
            }

            // check for \t or space in front of cursor
            QRegularExpression re(QStringLiteral("[\\t ]"));
            QRegularExpressionMatch match = re.match(cursor.selectedText());

            if (!match.hasMatch()) {
                // (select to) check for \t or space after the cursor
                cursor.setPosition(position);

                if (!cursor.atEnd()) {
                    cursor.setPosition(position + 1, QTextCursor::KeepAnchor);
                }
            }

            match = re.match(cursor.selectedText());

            if (match.hasMatch()) {
                cursor.removeSelectedText();
            }

            cursor = this->textCursor();
        }

        return true;
    }

    // else just insert indentCharacters
    cursor.insertText(indentCharacters);

    return true;
}